

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

ogg_int64_t ogg_page_granulepos(ogg_page *og)

{
  uchar *puVar1;
  ogg_uint64_t granulepos;
  uchar *page;
  ogg_page *og_local;
  
  puVar1 = og->header;
  return (((((((long)(int)(uint)puVar1[0xd] << 8 | (long)(int)(uint)puVar1[0xc]) << 8 |
             (long)(int)(uint)puVar1[0xb]) << 8 | (long)(int)(uint)puVar1[10]) << 8 |
           (long)(int)(uint)puVar1[9]) << 8 | (long)(int)(uint)puVar1[8]) << 8 |
         (long)(int)(uint)puVar1[7]) << 8 | (long)(int)(uint)puVar1[6];
}

Assistant:

ogg_int64_t ogg_page_granulepos(const ogg_page *og){
  unsigned char *page=og->header;
  ogg_uint64_t granulepos=page[13]&(0xff);
  granulepos= (granulepos<<8)|(page[12]&0xff);
  granulepos= (granulepos<<8)|(page[11]&0xff);
  granulepos= (granulepos<<8)|(page[10]&0xff);
  granulepos= (granulepos<<8)|(page[9]&0xff);
  granulepos= (granulepos<<8)|(page[8]&0xff);
  granulepos= (granulepos<<8)|(page[7]&0xff);
  granulepos= (granulepos<<8)|(page[6]&0xff);
  return((ogg_int64_t)granulepos);
}